

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_compact.cpp
# Opt level: O0

void __thiscall
icu_63::number::impl::CompactData::populate
          (CompactData *this,Locale *locale,char *nsName,CompactStyle compactStyle,
          CompactType compactType,UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  char *pcVar3;
  UResourceBundle *pUVar4;
  UErrorCode local_a4;
  undefined1 local_a0 [4];
  UErrorCode localStatus;
  CharString resourceKey;
  bool compactIsShort;
  bool nsIsLatn;
  LocalPointerBase<UResourceBundle> local_48;
  LocalUResourceBundlePointer rb;
  CompactDataSink sink;
  UErrorCode *status_local;
  CompactType compactType_local;
  CompactStyle compactStyle_local;
  char *nsName_local;
  Locale *locale_local;
  CompactData *this_local;
  
  CompactDataSink::CompactDataSink((CompactDataSink *)&rb,this);
  pcVar3 = Locale::getName(locale);
  pUVar4 = ures_open_63((char *)0x0,pcVar3,status);
  LocalUResourceBundlePointer::LocalUResourceBundlePointer
            ((LocalUResourceBundlePointer *)&local_48,pUVar4);
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    iVar2 = strcmp(nsName,"latn");
    resourceKey._63_1_ = iVar2 == 0;
    resourceKey._62_1_ = compactStyle == UNUM_SHORT;
    CharString::CharString((CharString *)local_a0);
    anon_unknown.dwarf_198d6a::getResourceBundleKey
              (nsName,compactStyle,compactType,(CharString *)local_a0,status);
    local_a4 = U_ZERO_ERROR;
    pUVar4 = LocalPointerBase<UResourceBundle>::getAlias(&local_48);
    pcVar3 = CharString::data((CharString *)local_a0);
    ures_getAllItemsWithFallback_63(pUVar4,pcVar3,(ResourceSink *)&rb,&local_a4);
    if ((this->isEmpty != '\0') && ((resourceKey._63_1_ & 1) == 0)) {
      anon_unknown.dwarf_198d6a::getResourceBundleKey
                ("latn",compactStyle,compactType,(CharString *)local_a0,status);
      local_a4 = U_ZERO_ERROR;
      pUVar4 = LocalPointerBase<UResourceBundle>::getAlias(&local_48);
      pcVar3 = CharString::data((CharString *)local_a0);
      ures_getAllItemsWithFallback_63(pUVar4,pcVar3,(ResourceSink *)&rb,&local_a4);
    }
    if ((this->isEmpty != '\0') && ((resourceKey._62_1_ & 1) == 0)) {
      anon_unknown.dwarf_198d6a::getResourceBundleKey
                (nsName,UNUM_SHORT,compactType,(CharString *)local_a0,status);
      local_a4 = U_ZERO_ERROR;
      pUVar4 = LocalPointerBase<UResourceBundle>::getAlias(&local_48);
      pcVar3 = CharString::data((CharString *)local_a0);
      ures_getAllItemsWithFallback_63(pUVar4,pcVar3,(ResourceSink *)&rb,&local_a4);
    }
    if (((this->isEmpty != '\0') && ((resourceKey._63_1_ & 1) == 0)) &&
       ((resourceKey._62_1_ & 1) == 0)) {
      anon_unknown.dwarf_198d6a::getResourceBundleKey
                ("latn",UNUM_SHORT,compactType,(CharString *)local_a0,status);
      local_a4 = U_ZERO_ERROR;
      pUVar4 = LocalPointerBase<UResourceBundle>::getAlias(&local_48);
      pcVar3 = CharString::data((CharString *)local_a0);
      ures_getAllItemsWithFallback_63(pUVar4,pcVar3,(ResourceSink *)&rb,&local_a4);
    }
    if (this->isEmpty != '\0') {
      *status = U_INTERNAL_PROGRAM_ERROR;
    }
    CharString::~CharString((CharString *)local_a0);
  }
  LocalUResourceBundlePointer::~LocalUResourceBundlePointer
            ((LocalUResourceBundlePointer *)&local_48);
  CompactDataSink::~CompactDataSink((CompactDataSink *)&rb);
  return;
}

Assistant:

void CompactData::populate(const Locale &locale, const char *nsName, CompactStyle compactStyle,
                           CompactType compactType, UErrorCode &status) {
    CompactDataSink sink(*this);
    LocalUResourceBundlePointer rb(ures_open(nullptr, locale.getName(), &status));
    if (U_FAILURE(status)) { return; }

    bool nsIsLatn = strcmp(nsName, "latn") == 0;
    bool compactIsShort = compactStyle == CompactStyle::UNUM_SHORT;

    // Fall back to latn numbering system and/or short compact style.
    CharString resourceKey;
    getResourceBundleKey(nsName, compactStyle, compactType, resourceKey, status);
    UErrorCode localStatus = U_ZERO_ERROR;
    ures_getAllItemsWithFallback(rb.getAlias(), resourceKey.data(), sink, localStatus);
    if (isEmpty && !nsIsLatn) {
        getResourceBundleKey("latn", compactStyle, compactType, resourceKey, status);
        localStatus = U_ZERO_ERROR;
        ures_getAllItemsWithFallback(rb.getAlias(), resourceKey.data(), sink, localStatus);
    }
    if (isEmpty && !compactIsShort) {
        getResourceBundleKey(nsName, CompactStyle::UNUM_SHORT, compactType, resourceKey, status);
        localStatus = U_ZERO_ERROR;
        ures_getAllItemsWithFallback(rb.getAlias(), resourceKey.data(), sink, localStatus);
    }
    if (isEmpty && !nsIsLatn && !compactIsShort) {
        getResourceBundleKey("latn", CompactStyle::UNUM_SHORT, compactType, resourceKey, status);
        localStatus = U_ZERO_ERROR;
        ures_getAllItemsWithFallback(rb.getAlias(), resourceKey.data(), sink, localStatus);
    }

    // The last fallback should be guaranteed to return data.
    if (isEmpty) {
        status = U_INTERNAL_PROGRAM_ERROR;
    }
}